

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O2

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
duckdb::StructDatePart::DeserializeFunction
          (Deserializer *deserializer,ScalarFunction *bound_function)

{
  _func_int **local_48;
  vector<duckdb::DatePartSpecifier,_true> part_codes;
  LogicalType stype;
  
  Deserializer::ReadProperty<duckdb::LogicalType>(&stype,(Deserializer *)bound_function,100,"stype")
  ;
  Deserializer::ReadProperty<duckdb::vector<duckdb::DatePartSpecifier,true>>
            (&part_codes,(Deserializer *)bound_function,0x65,"part_codes");
  make_uniq<duckdb::StructDatePart::BindData,duckdb::LogicalType,duckdb::vector<duckdb::DatePartSpecifier,true>>
            ((duckdb *)&local_48,&stype,&part_codes);
  deserializer->_vptr_Deserializer = local_48;
  ::std::_Vector_base<duckdb::DatePartSpecifier,_std::allocator<duckdb::DatePartSpecifier>_>::
  ~_Vector_base((_Vector_base<duckdb::DatePartSpecifier,_std::allocator<duckdb::DatePartSpecifier>_>
                 *)&part_codes);
  LogicalType::~LogicalType(&stype);
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)deserializer;
}

Assistant:

static unique_ptr<FunctionData> DeserializeFunction(Deserializer &deserializer, ScalarFunction &bound_function) {
		auto stype = deserializer.ReadProperty<LogicalType>(100, "stype");
		auto part_codes = deserializer.ReadProperty<vector<DatePartSpecifier>>(101, "part_codes");
		return make_uniq<BindData>(std::move(stype), std::move(part_codes));
	}